

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.h
# Opt level: O2

void upb_test::RoundTripDescriptor(FileDescriptorSet *set)

{
  _Bool _Var1;
  bool bVar2;
  void **ppvVar3;
  const_iterator cVar4;
  FileDescriptor *this;
  upb_FileDef *f;
  google_protobuf_FileDescriptorProto *msg;
  char *pcVar5;
  upb_Arena *arena_00;
  Message *message;
  EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto> *matcher;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  char *in_R9;
  AssertionResult gtest_ar_1;
  Arena arena;
  NullErrorCollector collector;
  DefPool defpool;
  google_protobuf_FileDescriptorProto *proto;
  string serialized;
  AssertHelper local_888;
  size_t size;
  AssertionResult gtest_ar_;
  FileDescriptorProto google_proto;
  AssertionResult gtest_ar__1;
  DescriptorPool desc_pool;
  FileDescriptorProto normalized_file;
  FileDescriptorProto local_420;
  FileDescriptorProto mutable_file;
  Status status;
  
  defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl = upb_DefPool_New();
  defpool.ptr_._M_t.super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
  super__Tuple_impl<1UL,_void_(*)(upb_DefPool_*)>.
  super__Head_base<1UL,_void_(*)(upb_DefPool_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(upb_DefPool_*),_false>)upb_DefPool_Free;
  google::protobuf::DescriptorPool::DescriptorPool(&desc_pool);
  desc_pool.enforce_weak_ = true;
  this_00 = &(set->field_0)._impl_.file_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    google::protobuf::FileDescriptorProto::FileDescriptorProto
              (&mutable_file,(FileDescriptorProto *)*ppvVar3);
    collector.super_ErrorCollector._vptr_ErrorCollector =
         (ErrorCollector)&PTR__ErrorCollector_00541da0;
    this = google::protobuf::DescriptorPool::BuildFileCollectingErrors
                     (&desc_pool,&mutable_file,&collector.super_ErrorCollector);
    if (this == (FileDescriptor *)0x0) {
      normalized_file.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)&normalized_file.field_0;
      normalized_file.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
      normalized_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ = 0;
      google::protobuf::MessageLite::SerializeToString
                ((MessageLite *)&mutable_file,(string *)&normalized_file);
      arena_00 = upb_Arena_New();
      google_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)upb_Arena_Free;
      google_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena_00;
      upb_Status_Clear(&status.status_);
      gtest_ar__1._0_8_ =
           google_protobuf_FileDescriptorProto_parse
                     ((char *)normalized_file.super_Message.super_MessageLite._vptr_MessageLite,
                      normalized_file.super_Message.super_MessageLite._internal_metadata_.ptr_,
                      arena_00);
      local_420.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
      testing::internal::CmpHelperNE<google_protobuf_FileDescriptorProto*,decltype(nullptr)>
                ((internal *)&gtest_ar_,"proto","nullptr",
                 (google_protobuf_FileDescriptorProto **)&gtest_ar__1,(void **)&local_420);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_420);
        pcVar5 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&serialized,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                   ,0x6c,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&serialized,(Message *)&local_420);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&serialized);
        if (local_420.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
          (**(code **)(*local_420.super_Message.super_MessageLite._vptr_MessageLite + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        upb_DefPool_AddFile(defpool.ptr_._M_t.
                            super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                            super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                            super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,
                            (google_protobuf_FileDescriptorProto *)gtest_ar__1._0_8_,&status.status_
                           );
      }
      std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr
                ((unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)> *)&google_proto);
      std::__cxx11::string::~string((string *)&normalized_file);
    }
    else {
      google::protobuf::FileDescriptorProto::FileDescriptorProto(&normalized_file);
      google::protobuf::FileDescriptor::CopyTo(this,&normalized_file);
      serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
      serialized._M_string_length = 0;
      serialized.field_2._M_local_buf[0] = '\0';
      google::protobuf::MessageLite::SerializeToString((MessageLite *)&normalized_file,&serialized);
      arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
      super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
      super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = upb_Arena_New();
      arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
      super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
      super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)>.
      super__Head_base<1UL,_void_(*)(upb_Arena_*),_false>._M_head_impl =
           (_Head_base<1UL,_void_(*)(upb_Arena_*),_false>)upb_Arena_Free;
      upb_Status_Clear(&status.status_);
      proto = google_protobuf_FileDescriptorProto_parse
                        (serialized._M_dataplus._M_p,serialized._M_string_length,
                         arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>.
                         _M_t.super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                         super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      testing::internal::CmpHelperNE<google_protobuf_FileDescriptorProto*,decltype(nullptr)>
                ((internal *)&google_proto,"proto","nullptr",&proto,(void **)&gtest_ar_);
      if ((char)google_proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (google_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ != 0) {
          pcVar5 = *(char **)google_proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                   ,0x49,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&google_proto.super_Message.super_MessageLite._internal_metadata_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&google_proto.super_Message.super_MessageLite._internal_metadata_);
        f = upb_DefPool_AddFile(defpool.ptr_._M_t.
                                super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                                super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>.
                                super__Head_base<0UL,_upb_DefPool_*,_false>._M_head_impl,proto,
                                &status.status_);
        if (f != (upb_FileDef *)0x0) {
          _Var1 = upb_Status_IsOk(&status.status_);
          gtest_ar_.success_ = _Var1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (_Var1) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            msg = upb_FileDef_ToProto(f,arena.ptr_._M_t.
                                        super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t
                                        .super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                                        super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
            pcVar5 = google_protobuf_FileDescriptorProto_serialize
                               (msg,arena.ptr_._M_t.
                                    super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                                    super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                                    super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl,&size);
            google::protobuf::FileDescriptorProto::FileDescriptorProto(&google_proto);
            bVar2 = google::protobuf::MessageLite::ParseFromArray
                              ((MessageLite *)&google_proto,pcVar5,(int)size);
            gtest_ar__1.success_ = bVar2;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (bVar2) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__1.message_);
              google::protobuf::FileDescriptorProto::FileDescriptorProto
                        (&local_420,&normalized_file);
              EqualsProtoTreatNansAsEqual<google::protobuf::FileDescriptorProto>
                        ((EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>
                          *)&gtest_ar__1,&local_420);
              testing::internal::
              MakePredicateFormatterFromMatcher<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
                        ((PredicateFormatterFromMatcher<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>_>
                          *)&gtest_ar_,(internal *)&gtest_ar__1,matcher);
              testing::internal::
              PredicateFormatterFromMatcher<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
              ::operator()(&gtest_ar_1,(char *)&gtest_ar_,(FileDescriptorProto *)"google_proto");
              google::protobuf::FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)&gtest_ar_);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto
                        ((FileDescriptorProto *)&gtest_ar__1);
              google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_420);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                pcVar5 = "";
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar5 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_888,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                           ,0x61,pcVar5);
                testing::internal::AssertHelper::operator=(&local_888,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper(&local_888);
                if (gtest_ar_._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
            }
            else {
              testing::Message::Message((Message *)&local_420);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"ok",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                         ,0x60,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&local_420);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if (local_420.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0)
              {
                (**(code **)(*local_420.super_Message.super_MessageLite._vptr_MessageLite + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__1.message_);
            }
            google::protobuf::FileDescriptorProto::~FileDescriptorProto(&google_proto);
          }
          else {
            testing::Message::Message((Message *)&gtest_ar__1);
            local_420.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int **)upb_Status_ErrorMessage(&status.status_);
            message = testing::Message::operator<<((Message *)&gtest_ar__1,(char **)&local_420);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&google_proto,(internal *)&gtest_ar_,
                       (AssertionResult *)"status.ok()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.h"
                       ,0x58,(char *)google_proto.super_Message.super_MessageLite._vptr_MessageLite)
            ;
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,message);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
            std::__cxx11::string::~string((string *)&google_proto);
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
        }
      }
      std::unique_ptr<upb_Arena,_void_(*)(upb_Arena_*)>::~unique_ptr(&arena.ptr_);
      std::__cxx11::string::~string((string *)&serialized);
      google::protobuf::FileDescriptorProto::~FileDescriptorProto(&normalized_file);
    }
    google::protobuf::DescriptorPool::ErrorCollector::~ErrorCollector
              (&collector.super_ErrorCollector);
    google::protobuf::FileDescriptorProto::~FileDescriptorProto(&mutable_file);
  }
  google::protobuf::DescriptorPool::~DescriptorPool(&desc_pool);
  std::unique_ptr<upb_DefPool,_void_(*)(upb_DefPool_*)>::~unique_ptr(&defpool.ptr_);
  return;
}

Assistant:

inline void RoundTripDescriptor(const google::protobuf::FileDescriptorSet& set) {
  upb::DefPool defpool;
  google::protobuf::DescriptorPool desc_pool;
  desc_pool.EnforceWeakDependencies(true);
  for (const auto& file : set.file()) {
    google::protobuf::FileDescriptorProto mutable_file(file);
    AddFile(mutable_file, &defpool, &desc_pool);
  }
}